

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O1

uint32_t aec_get_msb_32(aec_stream *strm)

{
  uint uVar1;
  
  uVar1 = *(uint *)strm->next_in;
  strm->next_in = (uchar *)((long)strm->next_in + 4);
  strm->avail_in = strm->avail_in - 4;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

uint32_t aec_get_msb_32(struct aec_stream *strm)
{
    uint32_t data;

    data = ((uint32_t)strm->next_in[0] << 24)
        | ((uint32_t)strm->next_in[1] << 16)
        | ((uint32_t)strm->next_in[2] << 8)
        | (uint32_t)strm->next_in[3];

    strm->next_in += 4;
    strm->avail_in -= 4;
    return data;
}